

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void shared_ptr_test(void)

{
  pointer *ppsVar1;
  long lVar2;
  bool bVar3;
  Xxx *pXVar4;
  ostream *poVar5;
  reference this;
  long in_FS_OFFSET;
  undefined1 local_70 [8];
  vector<shared_ptr<Xxx>,_std::allocator<shared_ptr<Xxx>_>_> PtrList;
  vector<shared_ptr<Xxx>,_std::allocator<shared_ptr<Xxx>_>_> PtrVec;
  undefined1 local_30 [8];
  shared_ptr<Xxx> yPtr;
  shared_ptr<Xxx> xPtr;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  shared_ptr<Xxx>::shared_ptr((shared_ptr<Xxx> *)&yPtr.px);
  std::operator<<((ostream *)&std::cout,"shared_ptr_test: in\n");
  bVar3 = shared_ptr::operator_cast_to_bool((shared_ptr *)&yPtr.px);
  if (bVar3) {
    abort();
  }
  pXVar4 = (Xxx *)operator_new(0x10);
  Xxx::Xxx(pXVar4,0x400);
  shared_ptr<Xxx>::shared_ptr((shared_ptr<Xxx> *)local_30,pXVar4);
  poVar5 = std::operator<<((ostream *)&std::cout,"yPtr=");
  pXVar4 = shared_ptr<Xxx>::get((shared_ptr<Xxx> *)local_30);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,pXVar4);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  bVar3 = shared_ptr::operator_cast_to_bool((shared_ptr *)local_30);
  if (!bVar3) {
    abort();
  }
  pXVar4 = shared_ptr<Xxx>::operator->((shared_ptr<Xxx> *)local_30);
  Xxx::doSomething(pXVar4);
  ppsVar1 = &PtrVec.super__Vector_base<shared_ptr<Xxx>,_std::allocator<shared_ptr<Xxx>_>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  shared_ptr<Xxx>::shared_ptr((shared_ptr<Xxx> *)ppsVar1,(shared_ptr<Xxx> *)local_30);
  shared_ptr<Xxx>::operator=((shared_ptr<Xxx> *)&yPtr.px,(shared_ptr<Xxx> *)ppsVar1);
  shared_ptr<Xxx>::~shared_ptr((shared_ptr<Xxx> *)ppsVar1);
  poVar5 = std::operator<<((ostream *)&std::cout,"xPtr=");
  pXVar4 = shared_ptr<Xxx>::get((shared_ptr<Xxx> *)&yPtr.px);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,pXVar4);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::cout,"yPtr=");
  pXVar4 = shared_ptr<Xxx>::get((shared_ptr<Xxx> *)local_30);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,pXVar4);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  ppsVar1 = &PtrList.super__Vector_base<shared_ptr<Xxx>,_std::allocator<shared_ptr<Xxx>_>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::vector<shared_ptr<Xxx>,_std::allocator<shared_ptr<Xxx>_>_>::vector
            ((vector<shared_ptr<Xxx>,_std::allocator<shared_ptr<Xxx>_>_> *)ppsVar1);
  std::vector<shared_ptr<Xxx>,_std::allocator<shared_ptr<Xxx>_>_>::push_back
            ((vector<shared_ptr<Xxx>,_std::allocator<shared_ptr<Xxx>_>_> *)ppsVar1,
             (value_type *)&yPtr.px);
  poVar5 = std::operator<<((ostream *)&std::cout,"xPtr=");
  pXVar4 = shared_ptr<Xxx>::get((shared_ptr<Xxx> *)&yPtr.px);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,pXVar4);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  std::vector<shared_ptr<Xxx>,_std::allocator<shared_ptr<Xxx>_>_>::~vector
            ((vector<shared_ptr<Xxx>,_std::allocator<shared_ptr<Xxx>_>_> *)
             &PtrList.super__Vector_base<shared_ptr<Xxx>,_std::allocator<shared_ptr<Xxx>_>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage);
  shared_ptr<Xxx>::~shared_ptr((shared_ptr<Xxx> *)local_30);
  poVar5 = std::operator<<((ostream *)&std::cout,"xPtr=");
  pXVar4 = shared_ptr<Xxx>::get((shared_ptr<Xxx> *)&yPtr.px);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,pXVar4);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  std::vector<shared_ptr<Xxx>,_std::allocator<shared_ptr<Xxx>_>_>::vector
            ((vector<shared_ptr<Xxx>,_std::allocator<shared_ptr<Xxx>_>_> *)local_70);
  std::vector<shared_ptr<Xxx>,_std::allocator<shared_ptr<Xxx>_>_>::push_back
            ((vector<shared_ptr<Xxx>,_std::allocator<shared_ptr<Xxx>_>_> *)local_70,
             (value_type *)&yPtr.px);
  poVar5 = std::operator<<((ostream *)&std::cout,"PtrList.back=");
  this = std::vector<shared_ptr<Xxx>,_std::allocator<shared_ptr<Xxx>_>_>::back
                   ((vector<shared_ptr<Xxx>,_std::allocator<shared_ptr<Xxx>_>_> *)local_70);
  pXVar4 = shared_ptr<Xxx>::get(this);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,pXVar4);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::cout,"xPtr=");
  pXVar4 = shared_ptr<Xxx>::get((shared_ptr<Xxx> *)&yPtr.px);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,pXVar4);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  std::vector<shared_ptr<Xxx>,_std::allocator<shared_ptr<Xxx>_>_>::~vector
            ((vector<shared_ptr<Xxx>,_std::allocator<shared_ptr<Xxx>_>_> *)local_70);
  poVar5 = std::operator<<((ostream *)&std::cout,"xPtr=");
  pXVar4 = shared_ptr<Xxx>::get((shared_ptr<Xxx> *)&yPtr.px);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,pXVar4);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"shared_ptr_test: out\n");
  shared_ptr<Xxx>::~shared_ptr((shared_ptr<Xxx> *)&yPtr.px);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void shared_ptr_test(void)
{
    // Create an empty (ie. NULL) shared_ptr
    shared_ptr<Xxx> xPtr;

    std::cout << "shared_ptr_test: in\n";

    if (xPtr) // empty pointer
    {
        abort(); // impossible
    }
    else
    {
        // Create a new Xxx object, and give its ownership to the yPtr shared_ptr
        shared_ptr<Xxx> yPtr(new Xxx(1024));
        // Same as :
        //shared_ptr<Xxx> yPtr;
        //yPtr.reset(new Xxx(1024));

        std::cout << "yPtr=" << yPtr.get() << std::endl;
        if (yPtr) // valid pointer
        {
            // Access members functions/variables like with a raw pointer
            yPtr->doSomething();
        }
        else
        {
            abort(); // impossible
        }

        // Share ownership by making a copy of the shared_ptr (the reference counter reaches 2)
        xPtr = yPtr;
        std::cout << "xPtr=" << xPtr.get() << std::endl;
        std::cout << "yPtr=" << yPtr.get() << std::endl;

        std::vector<shared_ptr<Xxx> > PtrVec;
        PtrVec.push_back(xPtr);
        std::cout << "xPtr=" << xPtr.get() << std::endl;

    } // yPtr is destroyed, but xPtr retains the ownership of the object

    std::cout << "xPtr=" << xPtr.get() << std::endl;

    {
        std::vector<shared_ptr<Xxx> > PtrList;
        PtrList.push_back(xPtr);

        std::cout << "PtrList.back=" << PtrList.back().get() << std::endl;
        std::cout << "xPtr=" << xPtr.get() << std::endl;
    }

    std::cout << "xPtr=" << xPtr.get() << std::endl;

    std::cout << "shared_ptr_test: out\n";

    // Same as :
    //xPtr.reset();
}